

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  const_reference pUVar5;
  UnknownFieldSet *unknown_fields_00;
  LogMessage *this_00;
  FieldDescriptor *pFVar6;
  int iVar7;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view sVar8;
  UnknownFieldSet intermediate_unknown_fields;
  Type type;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_58;
  OptionInterpreter *local_48;
  string *local_40;
  Type local_34;
  
  local_48 = this;
  local_40 = debug_msg_name;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    pFVar6 = innermost_field;
    iVar7 = 0;
    do {
      iVar3 = iVar7;
      bVar2 = (byte)pFVar6;
      iVar4 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
      if (iVar4 <= iVar3) goto LAB_00142c44;
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar3);
      pFVar6 = (FieldDescriptor *)(ulong)pUVar5->number_;
      iVar7 = iVar3 + 1;
    } while (pUVar5->number_ != innermost_field->number_);
    local_58.long_rep.elements_int = (uintptr_t)local_40;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::FieldDescriptor_const*,std::__cxx11::string_const&,google::protobuf::UnknownFieldSet_const&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = &local_58;
    bVar2 = AddNameError(local_48,make_error);
LAB_00142c44:
    bVar2 = iVar4 <= iVar3 | bVar2;
  }
  else {
    iVar7 = 0;
    while( true ) {
      iVar3 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
      if (iVar3 <= iVar7) break;
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar7);
      if (pUVar5->number_ == (*intermediate_fields_iter._M_current)->number_) {
        pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar7);
        local_34 = (Type)(*intermediate_fields_iter._M_current)->type_;
        if (local_34 == TYPE_GROUP) {
          if (pUVar5->type_ == 4) {
            unknown_fields_00 = UnknownField::group(pUVar5);
            bVar1 = ExamineIfOptionIsSet
                              (local_48,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,local_40,unknown_fields_00);
            if (!bVar1) {
LAB_00142c55:
              bVar2 = 0;
              goto LAB_00142c57;
            }
          }
        }
        else {
          if ((*intermediate_fields_iter._M_current)->type_ != 0xb) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_58.long_rep,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x2679);
            this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                ((LogMessage *)&local_58.long_rep,
                                 (char (*) [40])"Invalid wire type for CPPTYPE_MESSAGE: ");
            absl::lts_20250127::log_internal::LogMessage::
            operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(this_00,&local_34);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_58.long_rep);
          }
          if (pUVar5->type_ == 3) {
            local_58.long_rep.elements_int = 0;
            local_58.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
            sVar8 = UnknownField::length_delimited(pUVar5);
            bVar1 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)&local_58.long_rep,sVar8._M_str,(int)sVar8._M_len)
            ;
            if (bVar1) {
              bVar1 = ExamineIfOptionIsSet
                                (local_48,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,local_40,
                                 (UnknownFieldSet *)&local_58.long_rep);
              if (!bVar1) {
                UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&local_58.long_rep);
                goto LAB_00142c55;
              }
            }
            UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&local_58.long_rep);
          }
        }
      }
      iVar7 = iVar7 + 1;
    }
    bVar2 = 1;
  }
LAB_00142c57:
  return (bool)(bVar2 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError([&] {
          return absl::StrCat("Option \"", debug_msg_name,
                              "\" was already set.");
        });
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}